

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatVehicle.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatVehicle::operator==
          (GED_EnhancedGroundCombatVehicle *this,GED_EnhancedGroundCombatVehicle *Value)

{
  KBOOL KVar1;
  GED_EnhancedGroundCombatVehicle *Value_local;
  GED_EnhancedGroundCombatVehicle *this_local;
  
  KVar1 = GED_BasicGroundCombatVehicle::operator!=
                    (&this->super_GED_BasicGroundCombatVehicle,
                     &Value->super_GED_BasicGroundCombatVehicle);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui8FuelStatus == Value->m_ui8FuelStatus) {
    if (this->m_ui8GrndMaintStatus == Value->m_ui8GrndMaintStatus) {
      if (this->m_ui8PriAmmun == Value->m_ui8PriAmmun) {
        if (this->m_ui8SecAmmun == Value->m_ui8SecAmmun) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GED_EnhancedGroundCombatVehicle::operator == ( const GED_EnhancedGroundCombatVehicle & Value ) const
{
    if( GED_BasicGroundCombatVehicle::operator!=( Value ) )     return false;
    if( m_ui8FuelStatus         != Value.m_ui8FuelStatus )      return false;
    if( m_ui8GrndMaintStatus    != Value.m_ui8GrndMaintStatus ) return false;
    if( m_ui8PriAmmun           != Value.m_ui8PriAmmun )        return false;
    if( m_ui8SecAmmun           != Value.m_ui8SecAmmun )        return false;
    return true;
}